

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pedestrian.cpp
# Opt level: O3

int __thiscall
anon_unknown.dwarf_983a7::PedestrianPlugIn::open
          (PedestrianPlugIn *this,char *__file,int __oflag,...)

{
  this->cyclePD = -1;
  nextPD(this);
  this->population = 0;
  addPedestrianToCrowd(this);
  OpenSteer::OpenSteerDemo::init3dCamera
            ((AbstractVehicle *)
             *(this->crowd).
              super__Vector_base<(anonymous_namespace)::Pedestrian_*,_std::allocator<(anonymous_namespace)::Pedestrian_*>_>
              ._M_impl.super__Vector_impl_data._M_start);
  OpenSteer::OpenSteerDemo::camera.mode = cmFixedDistanceOffset;
  OpenSteer::OpenSteerDemo::camera.fixedTarget.y = 0.0;
  OpenSteer::OpenSteerDemo::camera.fixedTarget.z = 30.0;
  OpenSteer::OpenSteerDemo::camera.fixedPosition.x = 15.0;
  OpenSteer::OpenSteerDemo::camera.fixedPosition.y = 70.0;
  OpenSteer::OpenSteerDemo::camera.fixedPosition.z = -70.0;
  OpenSteer::OpenSteerDemo::camera.fixedTarget.x = 15.0;
  return 0x17aa00;
}

Assistant:

void open (void)
        {
            // make the database used to accelerate proximity queries
            cyclePD = -1;
            nextPD ();

            // create the specified number of Pedestrians
            population = 0;
            for (int i = 0; i < gPedestrianStartCount; i++) addPedestrianToCrowd ();

            // initialize camera and selectedVehicle
            Pedestrian& firstPedestrian = **crowd.begin();
            OpenSteerDemo::init3dCamera (firstPedestrian);
            OpenSteerDemo::camera.mode = Camera::cmFixedDistanceOffset;
            OpenSteerDemo::camera.fixedTarget.set (15, 0, 30);
            OpenSteerDemo::camera.fixedPosition.set (15, 70, -70);
        }